

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_ExtensionMissingExtendee_Test::
~ValidationErrorTest_ExtensionMissingExtendee_Test
          (ValidationErrorTest_ExtensionMissingExtendee_Test *this)

{
  ValidationErrorTest_ExtensionMissingExtendee_Test *this_local;
  
  ~ValidationErrorTest_ExtensionMissingExtendee_Test(this);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, ExtensionMissingExtendee) {
  BuildFileWithErrors(
      "name: \"foo.proto\" "
      "message_type {"
      "  name: \"Foo\""
      "  extension { name: \"foo\" number: 1 label: LABEL_OPTIONAL"
      "              type_name: \"Foo\" }"
      "}",

      "foo.proto: Foo.foo: EXTENDEE: FieldDescriptorProto.extendee not set for "
      "extension field.\n");
}